

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pod_vector.h
# Opt level: O3

void bk_lib::detail::fill<std::pair<unsigned_int,Clasp::ConstString>>
               (pair<unsigned_int,_Clasp::ConstString> *first,
               pair<unsigned_int,_Clasp::ConstString> *last,
               pair<unsigned_int,_Clasp::ConstString> *x)

{
  pair<unsigned_int,_Clasp::ConstString> *ppVar1;
  
  ppVar1 = first;
  switch((uint)((int)last - (int)first) >> 4 & 7) {
  case 0:
    while (ppVar1 != last) {
      first = ppVar1 + 1;
      ppVar1->first = x->first;
      Clasp::ConstString::ConstString(&ppVar1->second,&x->second);
switchD_00146020_caseD_7:
      ppVar1 = first + 1;
      first->first = x->first;
      Clasp::ConstString::ConstString(&first->second,&x->second);
switchD_00146020_caseD_6:
      first = ppVar1 + 1;
      ppVar1->first = x->first;
      Clasp::ConstString::ConstString(&ppVar1->second,&x->second);
switchD_00146020_caseD_5:
      ppVar1 = first + 1;
      first->first = x->first;
      Clasp::ConstString::ConstString(&first->second,&x->second);
switchD_00146020_caseD_4:
      first = ppVar1 + 1;
      ppVar1->first = x->first;
      Clasp::ConstString::ConstString(&ppVar1->second,&x->second);
switchD_00146020_caseD_3:
      ppVar1 = first + 1;
      first->first = x->first;
      Clasp::ConstString::ConstString(&first->second,&x->second);
switchD_00146020_caseD_2:
      first = ppVar1 + 1;
      ppVar1->first = x->first;
      Clasp::ConstString::ConstString(&ppVar1->second,&x->second);
switchD_00146020_caseD_1:
      first->first = x->first;
      Clasp::ConstString::ConstString(&first->second,&x->second);
      ppVar1 = first + 1;
    }
    break;
  case 1:
    goto switchD_00146020_caseD_1;
  case 2:
    goto switchD_00146020_caseD_2;
  case 3:
    goto switchD_00146020_caseD_3;
  case 4:
    goto switchD_00146020_caseD_4;
  case 5:
    goto switchD_00146020_caseD_5;
  case 6:
    goto switchD_00146020_caseD_6;
  case 7:
    goto switchD_00146020_caseD_7;
  }
  return;
}

Assistant:

void fill(T* first, T* last, const T& x) {
		assert(first <= last);
		switch ((last - first) & 7u)
		{
		case 0:
				while (first != last)
				{
				new(first++) T(x);
		case 7: new(first++) T(x);
		case 6: new(first++) T(x);
		case 5: new(first++) T(x);
		case 4: new(first++) T(x);
		case 3: new(first++) T(x);
		case 2: new(first++) T(x);
		case 1: new(first++) T(x);
				assert(first <= last);
				}
		}
	}